

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O2

string * lunasvg::parseUrl_abi_cxx11_(string_view input)

{
  bool bVar1;
  size_t in_RSI;
  string *in_RDI;
  string_view local_20;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  local_20._M_len = in_RSI;
  bVar1 = parseUrlValue(&local_20,in_RDI);
  if (!bVar1 || local_20._M_len != 0) {
    in_RDI->_M_string_length = 0;
    *(in_RDI->_M_dataplus)._M_p = '\0';
  }
  return in_RDI;
}

Assistant:

static std::string parseUrl(std::string_view input)
{
    std::string value;
    if(!parseUrlValue(input, value) || !input.empty())
        value.clear();
    return value;
}